

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

value_type * __thiscall
tsl::detail_robin_hash::
bucket_entry<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_false>::value
          (bucket_entry<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_false> *this)

{
  pair<const_void_*,_(anonymous_namespace)::WeakRef_*> *ppVar1;
  bucket_entry<std::pair<const_void_*,_(anonymous_namespace)::WeakRef_*>,_false> *this_local;
  
  ppVar1 = std::launder<std::pair<void_const*,(anonymous_namespace)::WeakRef*>>
                     ((pair<const_void_*,_(anonymous_namespace)::WeakRef_*> *)this->m_value);
  return ppVar1;
}

Assistant:

value_type& value() noexcept {
    tsl_rh_assert(!empty());
#if defined(__cplusplus) && __cplusplus >= 201703L
    return *std::launder(
        reinterpret_cast<value_type*>(std::addressof(m_value)));
#else
    return *reinterpret_cast<value_type*>(std::addressof(m_value));
#endif
  }